

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_d7a261::HandleJSONCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments,cmExecutionStatus *status)

{
  cmMakefile *this;
  pointer pcVar1;
  size_type sVar2;
  optional<(anonymous_namespace)::Args> errorPath;
  optional<(anonymous_namespace)::Args> errorPath_00;
  optional<(anonymous_namespace)::Args> errorPath_01;
  optional<(anonymous_namespace)::Args> errorPath_02;
  optional<(anonymous_namespace)::Args> errorPath_03;
  string_view value;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  bool bVar5;
  int iVar6;
  ArrayIndex AVar7;
  ArrayIndex AVar8;
  ValueType VVar9;
  string *name;
  string *psVar10;
  string *psVar11;
  Value *this_00;
  Value *pVVar12;
  json_error *pjVar13;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  Value *extraout_RDX;
  Value *extraout_RDX_00;
  Value *extraout_RDX_01;
  Value *extraout_RDX_02;
  Value *extraout_RDX_03;
  Value *value_00;
  size_type __rlen;
  size_type __rlen_7;
  Args path;
  string_view value_01;
  Args path_00;
  Args path_01;
  string_view value_02;
  Args path_02;
  string_view value_03;
  Args path_03;
  string_view value_04;
  string_view value_05;
  Args path_04;
  string_view value_06;
  string_view error;
  string_view error_00;
  string_view error_01;
  string_view error_02;
  string_view error_03;
  string_view error_04;
  string_view error_05;
  string_view error_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_03;
  string_view sVar15;
  const_iterator cVar16;
  Args args;
  Value json2;
  Value json;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ptrdiff_t local_128;
  char *local_120;
  string *local_118;
  Value local_110;
  undefined1 local_e8 [8];
  char *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  ValueIteratorBase local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_90;
  undefined1 local_88;
  undefined7 uStack_87;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50;
  uint7 uStack_4f;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  uint7 uStack_37;
  
  this = status->Makefile;
  _Var14._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_158._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  sVar15._M_str = "missing out-var argument";
  sVar15._M_len = 0x18;
  _Stack_150._M_current = _Var14._M_current;
  name = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_158,sVar15);
  if (((local_158._M_current == _Stack_150._M_current) ||
      (*(long *)((long)local_158._M_current + 8) != 0xe)) ||
     (iVar6 = bcmp(*(void **)local_158._M_current,"ERROR_VARIABLE",0xe), iVar6 != 0)) {
    psVar10 = (string *)0x0;
  }
  else {
    (anonymous_namespace)::Args::PopFront_abi_cxx11_
              ((Args *)&local_158,(string_view)(ZEXT816(0x71dc05) << 0x40));
    error_03._M_str = "missing error-var argument";
    error_03._M_len = 0x1a;
    psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_158,error_03);
    value_02._M_str = "NOTFOUND";
    value_02._M_len = 8;
    _Var14._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6edc54;
    cmMakefile::AddDefinition(this,psVar10,value_02);
  }
  error._M_str = "missing mode argument";
  error._M_len = 0x15;
  local_118 = psVar10;
  psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_158,error);
  pcVar1 = (psVar10->_M_dataplus)._M_p;
  sVar2 = psVar10->_M_string_length;
  if (((((sVar2 != 3) || (iVar6 = bcmp(pcVar1,"GET",3), iVar6 != 0)) &&
       ((sVar2 != 4 || (iVar6 = bcmp(pcVar1,"TYPE",4), iVar6 != 0)))) &&
      ((sVar2 != 6 ||
       (((iVar6 = bcmp(pcVar1,"MEMBER",6), iVar6 != 0 &&
         (iVar6 = bcmp(pcVar1,"LENGTH",6), iVar6 != 0)) &&
        (iVar6 = bcmp(pcVar1,"REMOVE",6), iVar6 != 0)))))) &&
     (((sVar2 != 3 || (iVar6 = bcmp(pcVar1,"SET",3), iVar6 != 0)) &&
      ((sVar2 != 5 || (iVar6 = bcmp(pcVar1,"EQUAL",5), iVar6 != 0)))))) {
    pjVar13 = (json_error *)__cxa_allocate_exception(0x28);
    local_148._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15;
    local_148._8_8_ = "got an invalid mode \'";
    local_138._8_8_ = (psVar10->_M_dataplus)._M_p;
    local_138._0_8_ = psVar10->_M_string_length;
    local_128 = 0x41;
    local_120 = "\', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET,  EQUAL";
    local_38 = 0;
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current =
         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )uStack_40;
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current =
         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )local_48;
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = (ulong)uStack_37 << 8;
    message._M_len = 3;
    message._M_array = (iterator)local_148;
    json_error::json_error(pjVar13,message,errorPath);
    __cxa_throw(pjVar13,&(anonymous_namespace)::json_error::typeinfo,
                std::runtime_error::~runtime_error);
  }
  error_00._M_str = "missing json string argument";
  error_00._M_len = 0x1c;
  psVar11 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_158,error_00);
  ReadJson(&local_110,psVar11);
  pcVar1 = (psVar10->_M_dataplus)._M_p;
  sVar2 = psVar10->_M_string_length;
  if ((sVar2 == 3) && (iVar6 = bcmp(pcVar1,"GET",3), iVar6 == 0)) {
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current = _Var14._M_current;
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current = _Stack_150._M_current;
    this_00 = ResolvePath((anon_unknown_dwarf_d7a261 *)&local_110,(Value *)local_158._M_current,path
                         );
    bVar5 = Json::Value::isObject(this_00);
    pVVar12 = extraout_RDX;
    if ((bVar5) || (bVar5 = Json::Value::isArray(this_00), pVVar12 = extraout_RDX_00, bVar5)) {
      (anonymous_namespace)::WriteJson_abi_cxx11_
                ((string *)local_148,(_anonymous_namespace_ *)this_00,pVVar12);
      value_01._M_str = (char *)local_148._0_8_;
      value_01._M_len = local_148._8_8_;
      cmMakefile::AddDefinition(this,name,value_01);
    }
    else {
      bVar5 = Json::Value::isBool(this_00);
      if (bVar5) {
        bVar5 = Json::Value::asBool(this_00);
        cmMakefile::AddDefinitionBool(this,name,bVar5);
        goto LAB_002dbfdc;
      }
      Json::Value::asString_abi_cxx11_((String *)local_148,this_00);
      value_04._M_str = (char *)local_148._0_8_;
      value_04._M_len = local_148._8_8_;
      cmMakefile::AddDefinition(this,name,value_04);
    }
  }
  else {
    if ((sVar2 == 4) && (iVar6 = bcmp(pcVar1,"TYPE",4), iVar6 == 0)) {
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var14._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_150._M_current;
      pVVar12 = ResolvePath((anon_unknown_dwarf_d7a261 *)&local_110,(Value *)local_158._M_current,
                            path_00);
      VVar9 = Json::Value::type(pVVar12);
      sVar15 = JsonTypeToString(VVar9);
      cmMakefile::AddDefinition(this,name,sVar15);
      goto LAB_002dbfdc;
    }
    if (sVar2 != 6) {
LAB_002dbb31:
      if ((sVar2 == 3) && (iVar6 = bcmp(pcVar1,"SET",3), iVar6 == 0)) {
        error_04._M_str = "missing new value remove";
        error_04._M_len = 0x18;
        psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_158,error_04);
        error_05._M_str = "missing member name to add";
        error_05._M_len = 0x1a;
        psVar11 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_158,error_05);
        _Var4._M_current = _Stack_150._M_current;
        _Var3._M_current = local_158._M_current;
        path_02.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current = _Var14._M_current;
        path_02.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current = _Stack_150._M_current;
        pVVar12 = ResolvePath((anon_unknown_dwarf_d7a261 *)&local_110,(Value *)local_158._M_current,
                              path_02);
        ReadJson((Value *)local_148,psVar10);
        bVar5 = Json::Value::isObject(pVVar12);
        if (bVar5) {
          pVVar12 = Json::Value::operator[](pVVar12,psVar11);
          Json::Value::operator=(pVVar12,(Value *)local_148);
          pVVar12 = extraout_RDX_01;
        }
        else {
          bVar5 = Json::Value::isArray(pVVar12);
          if (!bVar5) {
            pjVar13 = (json_error *)__cxa_allocate_exception(0x28);
            local_e8 = (undefined1  [8])&DAT_00000044;
            local_e0 = "SET needs to be called with an element of type OBJECT or ARRAY, got ";
            VVar9 = Json::Value::type(pVVar12);
            local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        )JsonTypeToString(VVar9);
            local_50 = 0;
            errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
            super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .End._M_current =
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )uStack_58;
            errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
            super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .Begin._M_current =
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )local_60;
            errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
            super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = (ulong)uStack_4f << 8
            ;
            message_01._M_len = 2;
            message_01._M_array = (iterator)local_e8;
            json_error::json_error(pjVar13,message_01,errorPath_01);
            __cxa_throw(pjVar13,&(anonymous_namespace)::json_error::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          local_e0 = (char *)(_Var4._M_current + 1);
          local_e8 = (undefined1  [8])_Var3._M_current;
          local_d8._M_local_buf[0] = 1;
          AVar7 = ParseIndex(psVar11,(optional<(anonymous_namespace)::Args> *)local_e8,0xffffffff);
          bVar5 = Json::Value::isValidIndex(pVVar12,AVar7);
          if (bVar5) {
            pVVar12 = Json::Value::operator[](pVVar12,AVar7);
            Json::Value::operator=(pVVar12,(Value *)local_148);
            pVVar12 = extraout_RDX_02;
          }
          else {
            Json::Value::append(pVVar12,(Value *)local_148);
            pVVar12 = extraout_RDX_03;
          }
        }
        (anonymous_namespace)::WriteJson_abi_cxx11_
                  ((string *)local_e8,(_anonymous_namespace_ *)&local_110,pVVar12);
        value_05._M_str = (char *)local_e8;
        value_05._M_len = (size_t)local_e0;
        cmMakefile::AddDefinition(this,name,value_05);
        if (local_e8 != (undefined1  [8])&local_d8) {
          operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
        }
      }
      else {
        if ((sVar2 != 5) || (iVar6 = bcmp(pcVar1,"EQUAL",5), iVar6 != 0)) goto LAB_002dbfdc;
        error_01._M_str = "missing second json string argument";
        error_01._M_len = 0x23;
        psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_158,error_01);
        ReadJson((Value *)local_148,psVar10);
        bVar5 = Json::Value::operator==(&local_110,(Value *)local_148);
        cmMakefile::AddDefinitionBool(this,name,bVar5);
      }
      Json::Value::~Value((Value *)local_148);
      goto LAB_002dbfdc;
    }
    iVar6 = bcmp(pcVar1,"MEMBER",6);
    if (iVar6 == 0) {
      error_02._M_str = "missing member index";
      error_02._M_len = 0x14;
      psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_158,error_02);
      _Var4._M_current = _Stack_150._M_current;
      _Var3._M_current = local_158._M_current;
      path_01.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var14._M_current;
      path_01.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_150._M_current;
      pVVar12 = ResolvePath((anon_unknown_dwarf_d7a261 *)&local_110,(Value *)local_158._M_current,
                            path_01);
      bVar5 = Json::Value::isObject(pVVar12);
      if (!bVar5) {
        pjVar13 = (json_error *)__cxa_allocate_exception(0x28);
        local_148._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3e;
        local_148._8_8_ = "MEMBER needs to be called with an element of type OBJECT, got ";
        VVar9 = Json::Value::type(pVVar12);
        local_138 = (undefined1  [16])JsonTypeToString(VVar9);
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_158._M_current;
        paStack_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Stack_150._M_current;
        local_68 = 1;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_67;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = true;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )_Stack_150._M_current;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_158._M_current;
        message_00._M_len = 2;
        message_00._M_array = (iterator)local_148;
        json_error::json_error(pjVar13,message_00,errorPath_00);
        __cxa_throw(pjVar13,&(anonymous_namespace)::json_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      local_148._8_8_ = _Var4._M_current + 1;
      local_148._0_8_ = _Var3._M_current;
      local_138[0] = 1;
      AVar8 = Json::Value::size(pVVar12);
      iVar6 = ParseIndex(psVar10,(optional<(anonymous_namespace)::Args> *)local_148,AVar8);
      cVar16 = Json::Value::begin(pVVar12);
      local_c8.current_ = cVar16.super_ValueIteratorBase.current_._M_node;
      local_c8.isNull_ = cVar16.super_ValueIteratorBase.isNull_;
      if (iVar6 < 1) {
        if (iVar6 != 0) {
          do {
            Json::ValueIteratorBase::decrement(&local_c8);
            iVar6 = iVar6 + 1;
          } while (iVar6 != 0);
        }
      }
      else {
        do {
          Json::ValueIteratorBase::increment(&local_c8);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      local_e8 = (undefined1  [8])local_c8.current_._M_node;
      local_e0 = (char *)CONCAT71(local_e0._1_7_,local_c8.isNull_);
      Json::ValueIteratorBase::name_abi_cxx11_((String *)local_148,(ValueIteratorBase *)local_e8);
      value_03._M_str = (char *)local_148._0_8_;
      value_03._M_len = local_148._8_8_;
      cmMakefile::AddDefinition(this,name,value_03);
    }
    else {
      iVar6 = bcmp(pcVar1,"LENGTH",6);
      if (iVar6 == 0) {
        path_03.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current = _Var14._M_current;
        path_03.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current = _Stack_150._M_current;
        pVVar12 = ResolvePath((anon_unknown_dwarf_d7a261 *)&local_110,(Value *)local_158._M_current,
                              path_03);
        bVar5 = Json::Value::isArray(pVVar12);
        if ((!bVar5) && (bVar5 = Json::Value::isObject(pVVar12), !bVar5)) {
          pjVar13 = (json_error *)__cxa_allocate_exception(0x28);
          local_148._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x47;
          local_148._8_8_ =
               "LENGTH needs to be called with an element of type ARRAY or OBJECT, got ";
          VVar9 = Json::Value::type(pVVar12);
          local_138 = (undefined1  [16])JsonTypeToString(VVar9);
          local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_158._M_current;
          paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)_Stack_150._M_current;
          local_88 = 1;
          errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_87;
          errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = true;
          errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )_Stack_150._M_current;
          errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_158._M_current;
          message_02._M_len = 2;
          message_02._M_array = (iterator)local_148;
          json_error::json_error(pjVar13,message_02,errorPath_02);
          __cxa_throw(pjVar13,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        AVar8 = Json::Value::size(pVVar12);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_148,AVar8);
        value._M_str = (char *)local_148._8_8_;
        value._M_len = local_148._0_8_;
        cmMakefile::AddDefinition(this,name,value);
        goto LAB_002dbfdc;
      }
      iVar6 = bcmp(pcVar1,"REMOVE",6);
      if (iVar6 != 0) goto LAB_002dbb31;
      error_06._M_str = "missing member or index to remove";
      error_06._M_len = 0x21;
      psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_158,error_06);
      _Var4._M_current = _Stack_150._M_current;
      _Var3._M_current = local_158._M_current;
      path_04.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var14._M_current;
      path_04.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_150._M_current;
      pVVar12 = ResolvePath((anon_unknown_dwarf_d7a261 *)&local_110,(Value *)local_158._M_current,
                            path_04);
      bVar5 = Json::Value::isArray(pVVar12);
      if (bVar5) {
        local_148._8_8_ = _Var4._M_current + 1;
        local_148._0_8_ = _Var3._M_current;
        local_138[0] = 1;
        AVar8 = Json::Value::size(pVVar12);
        AVar7 = ParseIndex(psVar10,(optional<(anonymous_namespace)::Args> *)local_148,AVar8);
        Json::Value::Value((Value *)local_148,nullValue);
        Json::Value::removeIndex(pVVar12,AVar7,(Value *)local_148);
      }
      else {
        bVar5 = Json::Value::isObject(pVVar12);
        if (!bVar5) {
          pjVar13 = (json_error *)__cxa_allocate_exception(0x28);
          local_148._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x47;
          local_148._8_8_ =
               "REMOVE needs to be called with an element of type ARRAY or OBJECT, got ";
          VVar9 = Json::Value::type(pVVar12);
          local_138 = (undefined1  [16])JsonTypeToString(VVar9);
          local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_158._M_current;
          paStack_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)_Stack_150._M_current;
          local_a8 = 1;
          errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_a7;
          errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = true;
          errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )_Stack_150._M_current;
          errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_158._M_current;
          message_03._M_len = 2;
          message_03._M_array = (iterator)local_148;
          json_error::json_error(pjVar13,message_03,errorPath_03);
          __cxa_throw(pjVar13,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        Json::Value::Value((Value *)local_148,nullValue);
        Json::Value::removeMember(pVVar12,psVar10,(Value *)local_148);
      }
      Json::Value::~Value((Value *)local_148);
      (anonymous_namespace)::WriteJson_abi_cxx11_
                ((string *)local_148,(_anonymous_namespace_ *)&local_110,value_00);
      value_06._M_str = (char *)local_148._0_8_;
      value_06._M_len = local_148._8_8_;
      cmMakefile::AddDefinition(this,name,value_06);
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138) {
    operator_delete((void *)local_148._0_8_,local_138._0_8_ + 1);
  }
LAB_002dbfdc:
  Json::Value::~Value(&local_110);
  return true;
}

Assistant:

bool HandleJSONCommand(std::vector<std::string> const& arguments,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)

  auto& makefile = status.GetMakefile();
  Args args{ arguments.begin() + 1, arguments.end() };

  const std::string* errorVariable = nullptr;
  const std::string* outputVariable = nullptr;
  bool success = true;

  try {
    outputVariable = &args.PopFront("missing out-var argument"_s);

    if (!args.empty() && *args.begin() == "ERROR_VARIABLE"_s) {
      args.PopFront("");
      errorVariable = &args.PopFront("missing error-var argument"_s);
      makefile.AddDefinition(*errorVariable, "NOTFOUND"_s);
    }

    const auto& mode = args.PopFront("missing mode argument"_s);
    if (mode != "GET"_s && mode != "TYPE"_s && mode != "MEMBER"_s &&
        mode != "LENGTH"_s && mode != "REMOVE"_s && mode != "SET"_s &&
        mode != "EQUAL"_s) {
      throw json_error(
        { "got an invalid mode '"_s, mode,
          "', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET, "
          " EQUAL"_s });
    }

    const auto& jsonstr = args.PopFront("missing json string argument"_s);
    Json::Value json = ReadJson(jsonstr);

    if (mode == "GET"_s) {
      const auto& value = ResolvePath(json, args);
      if (value.isObject() || value.isArray()) {
        makefile.AddDefinition(*outputVariable, WriteJson(value));
      } else if (value.isBool()) {
        makefile.AddDefinitionBool(*outputVariable, value.asBool());
      } else {
        makefile.AddDefinition(*outputVariable, value.asString());
      }

    } else if (mode == "TYPE"_s) {
      const auto& value = ResolvePath(json, args);
      makefile.AddDefinition(*outputVariable, JsonTypeToString(value.type()));

    } else if (mode == "MEMBER"_s) {
      const auto& indexStr = args.PopBack("missing member index"_s);
      const auto& value = ResolvePath(json, args);
      if (!value.isObject()) {
        throw json_error({ "MEMBER needs to be called with an element of "
                           "type OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }
      const auto index = ParseIndex(
        indexStr, Args{ args.begin(), args.end() + 1 }, value.size());
      const auto memIt = std::next(value.begin(), index);
      makefile.AddDefinition(*outputVariable, memIt.name());

    } else if (mode == "LENGTH"_s) {
      const auto& value = ResolvePath(json, args);
      if (!value.isArray() && !value.isObject()) {
        throw json_error({ "LENGTH needs to be called with an "
                           "element of type ARRAY or OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }

      cmAlphaNum sizeStr{ value.size() };
      makefile.AddDefinition(*outputVariable, sizeStr.View());

    } else if (mode == "REMOVE"_s) {
      const auto& toRemove =
        args.PopBack("missing member or index to remove"_s);
      auto& value = ResolvePath(json, args);

      if (value.isArray()) {
        const auto index = ParseIndex(
          toRemove, Args{ args.begin(), args.end() + 1 }, value.size());
        Json::Value removed;
        value.removeIndex(index, &removed);

      } else if (value.isObject()) {
        Json::Value removed;
        value.removeMember(toRemove, &removed);

      } else {
        throw json_error({ "REMOVE needs to be called with an "
                           "element of type ARRAY or OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }
      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "SET"_s) {
      const auto& newValueStr = args.PopBack("missing new value remove"_s);
      const auto& toAdd = args.PopBack("missing member name to add"_s);
      auto& value = ResolvePath(json, args);

      Json::Value newValue = ReadJson(newValueStr);
      if (value.isObject()) {
        value[toAdd] = newValue;
      } else if (value.isArray()) {
        const auto index =
          ParseIndex(toAdd, Args{ args.begin(), args.end() + 1 });
        if (value.isValidIndex(index)) {
          value[static_cast<int>(index)] = newValue;
        } else {
          value.append(newValue);
        }
      } else {
        throw json_error({ "SET needs to be called with an "
                           "element of type OBJECT or ARRAY, got "_s,
                           JsonTypeToString(value.type()) });
      }

      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "EQUAL"_s) {
      const auto& jsonstr2 =
        args.PopFront("missing second json string argument"_s);
      Json::Value json2 = ReadJson(jsonstr2);
      makefile.AddDefinitionBool(*outputVariable, json == json2);
    }

  } catch (const json_error& e) {
    if (outputVariable && e.ErrorPath) {
      const auto errorPath = cmJoin(*e.ErrorPath, "-");
      makefile.AddDefinition(*outputVariable,
                             cmCatViews({ errorPath, "-NOTFOUND"_s }));
    } else if (outputVariable) {
      makefile.AddDefinition(*outputVariable, "NOTFOUND"_s);
    }

    if (errorVariable) {
      makefile.AddDefinition(*errorVariable, e.what());
    } else {
      status.SetError(cmCatViews({ "sub-command JSON "_s, e.what(), "."_s }));
      success = false;
    }
  }
  return success;
#else
  status.SetError(cmStrCat(arguments[0], " not available during bootstrap"_s));
  return false;
#endif
}